

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O3

void rlDrawRenderBatch(RenderBatch *batch)

{
  Matrix *pMVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  GLenum GVar17;
  byte bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  _Bool _Var41;
  int iVar42;
  VertexBuffer *pVVar43;
  DrawCall *pDVar44;
  int iVar45;
  long lVar46;
  byte bVar47;
  int i;
  long lVar48;
  int iVar49;
  float fVar50;
  Matrix matProjection;
  float16 buffer;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pVVar43 = batch->vertexBuffer;
  lVar46 = (long)batch->currentBuffer;
  if (0 < pVVar43[lVar46].vCounter) {
    if (RLGL.ExtSupported.vao) {
      (*glad_glBindVertexArray)(pVVar43[lVar46].vaoId);
      pVVar43 = batch->vertexBuffer;
      lVar46 = (long)batch->currentBuffer;
    }
    (*glad_glBindBuffer)(0x8892,pVVar43[lVar46].vboId[0]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)batch->vertexBuffer[batch->currentBuffer].vCounter * 0xc,
               batch->vertexBuffer[batch->currentBuffer].vertices);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)batch->vertexBuffer[batch->currentBuffer].vCounter << 3,
               batch->vertexBuffer[batch->currentBuffer].texcoords);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)batch->vertexBuffer[batch->currentBuffer].vCounter << 2,
               batch->vertexBuffer[batch->currentBuffer].colors);
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glBindVertexArray)(0);
    }
  }
  _Var41 = RLGL.State.stereoRender;
  uVar40 = RLGL.State.projection._56_8_;
  uVar39 = RLGL.State.projection._48_8_;
  uVar38 = RLGL.State.projection._40_8_;
  uVar37 = RLGL.State.projection._32_8_;
  uVar36 = RLGL.State.projection._24_8_;
  fVar35 = RLGL.State.projection.m5;
  fVar34 = RLGL.State.projection.m1;
  fVar33 = RLGL.State.projection.m12;
  fVar32 = RLGL.State.projection.m8;
  uVar31 = RLGL.State.projection._0_8_;
  uVar30 = RLGL.State.modelview._56_8_;
  uVar29 = RLGL.State.modelview._48_8_;
  uVar28 = RLGL.State.modelview._40_8_;
  uVar27 = RLGL.State.modelview._32_8_;
  uVar26 = RLGL.State.modelview._24_8_;
  uVar25 = RLGL.State.modelview._16_8_;
  uVar24 = RLGL.State.modelview._8_8_;
  uVar23 = RLGL.State.modelview._0_8_;
  bVar47 = 1;
  lVar46 = 0;
  do {
    if (_Var41 != false) {
      (*glad_glViewport)(((int)lVar46 * RLGL.State.framebufferWidth) / 2,0,
                         RLGL.State.framebufferWidth / 2,RLGL.State.framebufferHeight);
      fVar50 = RLGL.State.viewOffsetStereo[lVar46].m0;
      fVar2 = RLGL.State.viewOffsetStereo[lVar46].m4;
      fVar3 = RLGL.State.viewOffsetStereo[lVar46].m8;
      fVar4 = RLGL.State.viewOffsetStereo[lVar46].m12;
      local_d8 = (float)uVar25;
      fStack_d4 = SUB84(uVar25,4);
      fStack_d0 = (float)uVar26;
      fStack_cc = SUB84(uVar26,4);
      local_c8 = (float)uVar23;
      fStack_c4 = SUB84(uVar23,4);
      fStack_c0 = (float)uVar24;
      fStack_bc = SUB84(uVar24,4);
      local_e8 = (float)uVar27;
      fStack_e4 = SUB84(uVar27,4);
      fStack_e0 = (float)uVar28;
      fStack_dc = SUB84(uVar28,4);
      local_f8 = (float)uVar29;
      fStack_f4 = SUB84(uVar29,4);
      fStack_f0 = (float)uVar30;
      fStack_ec = SUB84(uVar30,4);
      fVar5 = RLGL.State.viewOffsetStereo[lVar46].m5;
      fVar6 = RLGL.State.viewOffsetStereo[lVar46].m1;
      fVar7 = RLGL.State.viewOffsetStereo[lVar46].m9;
      fVar8 = RLGL.State.viewOffsetStereo[lVar46].m13;
      fVar9 = RLGL.State.viewOffsetStereo[lVar46].m6;
      fVar10 = RLGL.State.viewOffsetStereo[lVar46].m2;
      fVar11 = RLGL.State.viewOffsetStereo[lVar46].m10;
      fVar12 = RLGL.State.viewOffsetStereo[lVar46].m14;
      fVar13 = RLGL.State.viewOffsetStereo[lVar46].m7;
      fVar14 = RLGL.State.viewOffsetStereo[lVar46].m3;
      fVar15 = RLGL.State.viewOffsetStereo[lVar46].m11;
      fVar16 = RLGL.State.viewOffsetStereo[lVar46].m15;
      RLGL.State.modelview.m4 =
           fVar4 * fStack_f4 + fVar3 * fStack_e4 + fVar50 * fStack_c4 + fVar2 * fStack_d4;
      RLGL.State.modelview.m0 =
           fVar4 * local_f8 + fVar3 * local_e8 + fVar50 * local_c8 + fVar2 * local_d8;
      RLGL.State.modelview.m12 =
           fVar4 * fStack_ec + fVar3 * fStack_dc + fVar50 * fStack_bc + fVar2 * fStack_cc;
      RLGL.State.modelview.m8 =
           fVar4 * fStack_f0 + fVar3 * fStack_e0 + fVar50 * fStack_c0 + fVar2 * fStack_d0;
      RLGL.State.modelview.m5 =
           fVar8 * fStack_f4 + fVar7 * fStack_e4 + fVar6 * fStack_c4 + fVar5 * fStack_d4;
      RLGL.State.modelview.m1 =
           fVar8 * local_f8 + fVar7 * local_e8 + fVar6 * local_c8 + fVar5 * local_d8;
      RLGL.State.modelview.m13 =
           fVar8 * fStack_ec + fVar7 * fStack_dc + fVar6 * fStack_bc + fVar5 * fStack_cc;
      RLGL.State.modelview.m9 =
           fVar8 * fStack_f0 + fVar7 * fStack_e0 + fVar6 * fStack_c0 + fVar5 * fStack_d0;
      RLGL.State.modelview.m6 =
           fVar12 * fStack_f4 + fVar11 * fStack_e4 + fVar10 * fStack_c4 + fVar9 * fStack_d4;
      RLGL.State.modelview.m2 =
           fVar12 * local_f8 + fVar11 * local_e8 + fVar10 * local_c8 + fVar9 * local_d8;
      RLGL.State.modelview.m14 =
           fVar12 * fStack_ec + fVar11 * fStack_dc + fVar10 * fStack_bc + fVar9 * fStack_cc;
      RLGL.State.modelview.m10 =
           fVar12 * fStack_f0 + fVar11 * fStack_e0 + fVar10 * fStack_c0 + fVar9 * fStack_d0;
      RLGL.State.modelview.m7 =
           fVar16 * fStack_f4 + fVar15 * fStack_e4 + fVar14 * fStack_c4 + fVar13 * fStack_d4;
      RLGL.State.modelview.m3 =
           fVar16 * local_f8 + fVar15 * local_e8 + fVar14 * local_c8 + fVar13 * local_d8;
      RLGL.State.modelview.m15 =
           fVar16 * fStack_ec + fVar15 * fStack_dc + fVar14 * fStack_bc + fVar13 * fStack_cc;
      RLGL.State.modelview.m11 =
           fVar16 * fStack_f0 + fVar15 * fStack_e0 + fVar14 * fStack_c0 + fVar13 * fStack_d0;
      pMVar1 = RLGL.State.projectionStereo + lVar46;
      RLGL.State.projection.m0 = pMVar1->m0;
      RLGL.State.projection.m4 = pMVar1->m4;
      pMVar1 = RLGL.State.projectionStereo + lVar46;
      uVar19 = pMVar1->m8;
      uVar20 = pMVar1->m12;
      pMVar1 = RLGL.State.projectionStereo + lVar46;
      uVar21 = pMVar1->m1;
      uVar22 = pMVar1->m5;
      pMVar1 = RLGL.State.projectionStereo + lVar46;
      RLGL.State.projection.m9 = pMVar1->m9;
      RLGL.State.projection.m13 = pMVar1->m13;
      pMVar1 = RLGL.State.projectionStereo + lVar46;
      RLGL.State.projection.m2 = pMVar1->m2;
      RLGL.State.projection.m6 = pMVar1->m6;
      pMVar1 = RLGL.State.projectionStereo + lVar46;
      RLGL.State.projection.m10 = pMVar1->m10;
      RLGL.State.projection.m14 = pMVar1->m14;
      pMVar1 = RLGL.State.projectionStereo + lVar46;
      RLGL.State.projection.m3 = pMVar1->m3;
      RLGL.State.projection.m7 = pMVar1->m7;
      pMVar1 = RLGL.State.projectionStereo + lVar46;
      RLGL.State.projection.m11 = pMVar1->m11;
      RLGL.State.projection.m15 = pMVar1->m15;
      RLGL.State.projection.m8 = (float)uVar19;
      RLGL.State.projection.m12 = (float)uVar20;
      RLGL.State.projection.m1 = (float)uVar21;
      RLGL.State.projection.m5 = (float)uVar22;
    }
    if (0 < batch->vertexBuffer[batch->currentBuffer].vCounter) {
      (*glad_glUseProgram)(RLGL.State.currentShader.id);
      fVar50 = RLGL.State.projection.m0;
      local_78 = RLGL.State.modelview.m3 * RLGL.State.projection.m12 +
                 RLGL.State.modelview.m2 * RLGL.State.projection.m8 +
                 RLGL.State.modelview.m0 * fVar50 +
                 RLGL.State.modelview.m1 * RLGL.State.projection.m4;
      fStack_74 = RLGL.State.modelview.m3 * RLGL.State.projection.m13 +
                  RLGL.State.modelview.m2 * RLGL.State.projection.m9 +
                  RLGL.State.modelview.m0 * RLGL.State.projection.m1 +
                  RLGL.State.modelview.m1 * RLGL.State.projection.m5;
      fStack_70 = RLGL.State.modelview.m3 * RLGL.State.projection.m14 +
                  RLGL.State.modelview.m2 * RLGL.State.projection.m10 +
                  RLGL.State.modelview.m0 * RLGL.State.projection.m2 +
                  RLGL.State.projection.m6 * RLGL.State.modelview.m1;
      fStack_6c = RLGL.State.modelview.m3 * RLGL.State.projection.m15 +
                  RLGL.State.modelview.m2 * RLGL.State.projection.m11 +
                  RLGL.State.modelview.m0 * RLGL.State.projection.m3 +
                  RLGL.State.modelview.m1 * RLGL.State.projection.m7;
      local_68 = RLGL.State.modelview.m7 * RLGL.State.projection.m12 +
                 RLGL.State.modelview.m6 * RLGL.State.projection.m8 +
                 RLGL.State.modelview.m4 * fVar50 +
                 RLGL.State.modelview.m5 * RLGL.State.projection.m4;
      fStack_64 = RLGL.State.modelview.m7 * RLGL.State.projection.m13 +
                  RLGL.State.modelview.m6 * RLGL.State.projection.m9 +
                  RLGL.State.modelview.m4 * RLGL.State.projection.m1 +
                  RLGL.State.modelview.m5 * RLGL.State.projection.m5;
      fStack_60 = RLGL.State.modelview.m7 * RLGL.State.projection.m14 +
                  RLGL.State.modelview.m6 * RLGL.State.projection.m10 +
                  RLGL.State.modelview.m4 * RLGL.State.projection.m2 +
                  RLGL.State.projection.m6 * RLGL.State.modelview.m5;
      fStack_5c = RLGL.State.modelview.m7 * RLGL.State.projection.m15 +
                  RLGL.State.modelview.m6 * RLGL.State.projection.m11 +
                  RLGL.State.modelview.m4 * RLGL.State.projection.m3 +
                  RLGL.State.modelview.m5 * RLGL.State.projection.m7;
      local_58 = RLGL.State.modelview.m11 * RLGL.State.projection.m12 +
                 RLGL.State.modelview.m10 * RLGL.State.projection.m8 +
                 RLGL.State.modelview.m8 * fVar50 +
                 RLGL.State.modelview.m9 * RLGL.State.projection.m4;
      fStack_54 = RLGL.State.modelview.m11 * RLGL.State.projection.m13 +
                  RLGL.State.modelview.m10 * RLGL.State.projection.m9 +
                  RLGL.State.modelview.m8 * RLGL.State.projection.m1 +
                  RLGL.State.modelview.m9 * RLGL.State.projection.m5;
      fStack_50 = RLGL.State.modelview.m11 * RLGL.State.projection.m14 +
                  RLGL.State.modelview.m10 * RLGL.State.projection.m10 +
                  RLGL.State.modelview.m8 * RLGL.State.projection.m2 +
                  RLGL.State.projection.m6 * RLGL.State.modelview.m9;
      fStack_4c = RLGL.State.modelview.m11 * RLGL.State.projection.m15 +
                  RLGL.State.modelview.m10 * RLGL.State.projection.m11 +
                  RLGL.State.modelview.m8 * RLGL.State.projection.m3 +
                  RLGL.State.modelview.m9 * RLGL.State.projection.m7;
      local_48 = RLGL.State.modelview.m15 * RLGL.State.projection.m12 +
                 RLGL.State.modelview.m14 * RLGL.State.projection.m8 +
                 RLGL.State.modelview.m12 * fVar50 +
                 RLGL.State.modelview.m13 * RLGL.State.projection.m4;
      fStack_44 = RLGL.State.modelview.m15 * RLGL.State.projection.m13 +
                  RLGL.State.modelview.m14 * RLGL.State.projection.m9 +
                  RLGL.State.modelview.m12 * RLGL.State.projection.m1 +
                  RLGL.State.modelview.m13 * RLGL.State.projection.m5;
      fStack_40 = RLGL.State.modelview.m15 * RLGL.State.projection.m14 +
                  RLGL.State.modelview.m14 * RLGL.State.projection.m10 +
                  RLGL.State.modelview.m12 * RLGL.State.projection.m2 +
                  RLGL.State.modelview.m13 * RLGL.State.projection.m6;
      fStack_3c = RLGL.State.modelview.m15 * RLGL.State.projection.m15 +
                  RLGL.State.modelview.m14 * RLGL.State.projection.m11 +
                  RLGL.State.modelview.m12 * RLGL.State.projection.m3 +
                  RLGL.State.modelview.m13 * RLGL.State.projection.m7;
      (*glad_glUniformMatrix4fv)(RLGL.State.currentShader.locs[6],1,'\0',&local_78);
      if (RLGL.ExtSupported.vao == true) {
        (*glad_glBindVertexArray)(batch->vertexBuffer[batch->currentBuffer].vaoId);
      }
      else {
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        (*glad_glVertexAttribPointer)(*RLGL.State.currentShader.locs,3,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(*RLGL.State.currentShader.locs);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        (*glad_glVertexAttribPointer)(RLGL.State.currentShader.locs[1],2,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[1]);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        (*glad_glVertexAttribPointer)
                  (RLGL.State.currentShader.locs[5],4,0x1401,'\x01',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[5]);
        (*glad_glBindBuffer)(0x8893,batch->vertexBuffer[batch->currentBuffer].vboId[3]);
      }
      (*glad_glUniform4f)(RLGL.State.currentShader.locs[0xc],1.0,1.0,1.0,1.0);
      (*glad_glUniform1i)(RLGL.State.currentShader.locs[0xf],0);
      lVar46 = 0;
      do {
        if (RLGL.State.activeTextureId[lVar46] != 0) {
          (*glad_glActiveTexture)((int)lVar46 + 0x84c1);
          (*glad_glBindTexture)(0xde1,RLGL.State.activeTextureId[lVar46]);
        }
        lVar46 = lVar46 + 1;
      } while (lVar46 != 4);
      (*glad_glActiveTexture)(0x84c0);
      if (0 < batch->drawsCounter) {
        pDVar44 = batch->draws;
        lVar48 = 0;
        lVar46 = 0;
        iVar49 = 0;
        do {
          (*glad_glBindTexture)(0xde1,*(GLuint *)((long)&pDVar44->textureId + lVar48));
          pDVar44 = batch->draws;
          GVar17 = *(GLenum *)((long)&pDVar44->mode + lVar48);
          if ((GVar17 == 4) || (GVar17 == 1)) {
            (*glad_glDrawArrays)(GVar17,iVar49,*(GLsizei *)((long)&pDVar44->vertexCount + lVar48));
          }
          else {
            iVar42 = *(int *)((long)&pDVar44->vertexCount + lVar48);
            iVar45 = iVar42 + 3;
            if (-1 < iVar42) {
              iVar45 = iVar42;
            }
            iVar42 = iVar49 + 3;
            if (-1 < iVar49) {
              iVar42 = iVar49;
            }
            (*glad_glDrawElements)
                      (4,(iVar45 >> 2) * 6,0x1405,(void *)((long)((iVar42 >> 2) * 6) << 2));
          }
          pDVar44 = batch->draws;
          iVar49 = iVar49 + *(int *)((long)&pDVar44->vertexCount + lVar48) +
                   *(int *)((long)&pDVar44->vertexAlignment + lVar48);
          lVar46 = lVar46 + 1;
          lVar48 = lVar48 + 0x10;
        } while (lVar46 < batch->drawsCounter);
      }
      if (RLGL.ExtSupported.vao == false) {
        (*glad_glBindBuffer)(0x8892,0);
        (*glad_glBindBuffer)(0x8893,0);
      }
      (*glad_glBindTexture)(0xde1,0);
    }
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glBindVertexArray)(0);
    }
    lVar48 = 0;
    (*glad_glUseProgram)(0);
    lVar46 = 1;
    bVar18 = bVar47 & _Var41;
    bVar47 = 0;
  } while (bVar18 != 0);
  batch->vertexBuffer[batch->currentBuffer].vCounter = 0;
  batch->vertexBuffer[batch->currentBuffer].tcCounter = 0;
  batch->vertexBuffer[batch->currentBuffer].cCounter = 0;
  batch->currentDepth = -1.0;
  RLGL.State.modelview._0_8_ = uVar23;
  RLGL.State.modelview._8_8_ = uVar24;
  RLGL.State.modelview._16_8_ = uVar25;
  RLGL.State.modelview._24_8_ = uVar26;
  RLGL.State.modelview._32_8_ = uVar27;
  RLGL.State.modelview._40_8_ = uVar28;
  RLGL.State.modelview._48_8_ = uVar29;
  RLGL.State.modelview._56_8_ = uVar30;
  RLGL.State.projection._0_8_ = uVar31;
  RLGL.State.projection.m8 = fVar32;
  RLGL.State.projection.m12 = fVar33;
  RLGL.State.projection.m1 = fVar34;
  RLGL.State.projection.m5 = fVar35;
  RLGL.State.projection._24_8_ = uVar36;
  RLGL.State.projection._32_8_ = uVar37;
  RLGL.State.projection._40_8_ = uVar38;
  RLGL.State.projection._48_8_ = uVar39;
  RLGL.State.projection._56_8_ = uVar40;
  do {
    *(undefined4 *)((long)&batch->draws->mode + lVar48) = 7;
    *(undefined4 *)((long)&batch->draws->vertexCount + lVar48) = 0;
    *(uint *)((long)&batch->draws->textureId + lVar48) = RLGL.State.defaultTextureId;
    lVar48 = lVar48 + 0x10;
  } while (lVar48 != 0x1000);
  RLGL.State.activeTextureId[0] = 0;
  RLGL.State.activeTextureId[1] = 0;
  RLGL.State.activeTextureId[2] = 0;
  RLGL.State.activeTextureId[3] = 0;
  batch->drawsCounter = 1;
  iVar42 = batch->currentBuffer + 1;
  iVar49 = 0;
  if (iVar42 < batch->buffersCount) {
    iVar49 = iVar42;
  }
  batch->currentBuffer = iVar49;
  return;
}

Assistant:

void rlDrawRenderBatch(RenderBatch *batch)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Update batch vertex buffers
    //------------------------------------------------------------------------------------------------------------
    // NOTE: If there is not vertex data, buffers doesn't need to be updated (vertexCount > 0)
    // TODO: If no data changed on the CPU arrays --> No need to re-update GPU arrays (change flag required)
    if (batch->vertexBuffer[batch->currentBuffer].vCounter > 0)
    {
        // Activate elements VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);

        // Vertex positions buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*3*sizeof(float), batch->vertexBuffer[batch->currentBuffer].vertices);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*3*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].vertices, GL_DYNAMIC_DRAW);  // Update all buffer

        // Texture coordinates buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*2*sizeof(float), batch->vertexBuffer[batch->currentBuffer].texcoords);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*2*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].texcoords, GL_DYNAMIC_DRAW); // Update all buffer

        // Colors buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*4*sizeof(unsigned char), batch->vertexBuffer[batch->currentBuffer].colors);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*4*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].colors, GL_DYNAMIC_DRAW);    // Update all buffer

        // NOTE: glMapBuffer() causes sync issue.
        // If GPU is working with this buffer, glMapBuffer() will wait(stall) until GPU to finish its job.
        // To avoid waiting (idle), you can call first glBufferData() with NULL pointer before glMapBuffer().
        // If you do that, the previous data in PBO will be discarded and glMapBuffer() returns a new
        // allocated pointer immediately even if GPU is still working with the previous data.

        // Another option: map the buffer object into client's memory
        // Probably this code could be moved somewhere else...
        // batch->vertexBuffer[batch->currentBuffer].vertices = (float *)glMapBuffer(GL_ARRAY_BUFFER, GL_READ_WRITE);
        // if (batch->vertexBuffer[batch->currentBuffer].vertices)
        // {
            // Update vertex data
        // }
        // glUnmapBuffer(GL_ARRAY_BUFFER);

        // Unbind the current VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    }
    //------------------------------------------------------------------------------------------------------------

    // Draw batch vertex buffers (considering VR stereo if required)
    //------------------------------------------------------------------------------------------------------------
    Matrix matProjection = RLGL.State.projection;
    Matrix matModelView = RLGL.State.modelview;

    int eyesCount = 1;
    if (RLGL.State.stereoRender) eyesCount = 2;

    for (int eye = 0; eye < eyesCount; eye++)
    {
        if (eyesCount == 2)
        {
            // Setup current eye viewport (half screen width)
            rlViewport(eye*RLGL.State.framebufferWidth/2, 0, RLGL.State.framebufferWidth/2, RLGL.State.framebufferHeight);

            // Set current eye view offset to modelview matrix
            rlSetMatrixModelview(MatrixMultiply(matModelView, RLGL.State.viewOffsetStereo[eye]));
            // Set current eye projection matrix
            rlSetMatrixProjection(RLGL.State.projectionStereo[eye]);
        }

        // Draw buffers
        if (batch->vertexBuffer[batch->currentBuffer].vCounter > 0)
        {
            // Set current shader and upload current MVP matrix
            glUseProgram(RLGL.State.currentShader.id);

            // Create modelview-projection matrix and upload to shader
            Matrix matMVP = MatrixMultiply(RLGL.State.modelview, RLGL.State.projection);
            glUniformMatrix4fv(RLGL.State.currentShader.locs[SHADER_LOC_MATRIX_MVP], 1, false, MatrixToFloat(matMVP));

            if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);
            else
            {
                // Bind vertex attrib: position (shader-location = 0)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION], 3, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION]);

                // Bind vertex attrib: texcoord (shader-location = 1)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01], 2, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01]);

                // Bind vertex attrib: color (shader-location = 3)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR], 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR]);

                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[3]);
            }

            // Setup some default shader values
            glUniform4f(RLGL.State.currentShader.locs[SHADER_LOC_COLOR_DIFFUSE], 1.0f, 1.0f, 1.0f, 1.0f);
            glUniform1i(RLGL.State.currentShader.locs[SHADER_LOC_MAP_DIFFUSE], 0);  // Active default sampler2D: texture0

            // Activate additional sampler textures
            // Those additional textures will be common for all draw calls of the batch
            for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++)
            {
                if (RLGL.State.activeTextureId[i] > 0)
                {
                    glActiveTexture(GL_TEXTURE0 + 1 + i);
                    glBindTexture(GL_TEXTURE_2D, RLGL.State.activeTextureId[i]);
                }
            }

            // Activate default sampler2D texture0 (one texture is always active for default batch shader)
            // NOTE: Batch system accumulates calls by texture0 changes, additional textures are enabled for all the draw calls
            glActiveTexture(GL_TEXTURE0);

            for (int i = 0, vertexOffset = 0; i < batch->drawsCounter; i++)
            {
                // Bind current draw call texture, activated as GL_TEXTURE0 and binded to sampler2D texture0 by default
                glBindTexture(GL_TEXTURE_2D, batch->draws[i].textureId);

                if ((batch->draws[i].mode == RL_LINES) || (batch->draws[i].mode == RL_TRIANGLES)) glDrawArrays(batch->draws[i].mode, vertexOffset, batch->draws[i].vertexCount);
                else
                {
#if defined(GRAPHICS_API_OPENGL_33)
                    // We need to define the number of indices to be processed: quadsCount*6
                    // NOTE: The final parameter tells the GPU the offset in bytes from the
                    // start of the index buffer to the location of the first index to process
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_INT, (GLvoid *)(vertexOffset/4*6*sizeof(GLuint)));
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_SHORT, (GLvoid *)(vertexOffset/4*6*sizeof(GLushort)));
#endif
                }

                vertexOffset += (batch->draws[i].vertexCount + batch->draws[i].vertexAlignment);
            }

            if (!RLGL.ExtSupported.vao)
            {
                glBindBuffer(GL_ARRAY_BUFFER, 0);
                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
            }

            glBindTexture(GL_TEXTURE_2D, 0);    // Unbind textures
        }

        if (RLGL.ExtSupported.vao) glBindVertexArray(0); // Unbind VAO

        glUseProgram(0);    // Unbind shader program
    }
    //------------------------------------------------------------------------------------------------------------

    // Reset batch buffers
    //------------------------------------------------------------------------------------------------------------
    // Reset vertex counters for next frame
    batch->vertexBuffer[batch->currentBuffer].vCounter = 0;
    batch->vertexBuffer[batch->currentBuffer].tcCounter = 0;
    batch->vertexBuffer[batch->currentBuffer].cCounter = 0;

    // Reset depth for next draw
    batch->currentDepth = -1.0f;

    // Restore projection/modelview matrices
    RLGL.State.projection = matProjection;
    RLGL.State.modelview = matModelView;

    // Reset RLGL.currentBatch->draws array
    for (int i = 0; i < DEFAULT_BATCH_DRAWCALLS; i++)
    {
        batch->draws[i].mode = RL_QUADS;
        batch->draws[i].vertexCount = 0;
        batch->draws[i].textureId = RLGL.State.defaultTextureId;
    }

    // Reset active texture units for next batch
    for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++) RLGL.State.activeTextureId[i] = 0;

    // Reset draws counter to one draw for the batch
    batch->drawsCounter = 1;
    //------------------------------------------------------------------------------------------------------------

    // Change to next buffer in the list (in case of multi-buffering)
    batch->currentBuffer++;
    if (batch->currentBuffer >= batch->buffersCount) batch->currentBuffer = 0;
#endif
}